

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                    (string *str,uint8_t *target)

{
  uint uVar1;
  string *psVar2;
  uint8_t *__dest;
  uint local_24;
  size_type local_20 [2];
  
  local_20[0] = str->_M_string_length;
  local_24 = 0xffffffff;
  psVar2 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_int>
                     (local_20,&local_24,"str.size() <= std::numeric_limits<uint32_t>::max()");
  if (psVar2 == (string *)0x0) {
    __dest = WriteVarint32ToArray((uint32_t)str->_M_string_length,target);
    uVar1 = (uint)str->_M_string_length;
    memcpy(__dest,(str->_M_dataplus)._M_p,(ulong)uVar1);
    return __dest + (int)uVar1;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
             ,0x408,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20);
}

Assistant:

uint8_t* CodedOutputStream::WriteStringWithSizeToArray(const std::string& str,
                                                     uint8_t* target) {
  ABSL_DCHECK_LE(str.size(), std::numeric_limits<uint32_t>::max());
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}